

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int __thiscall cppwinrt::run(cppwinrt *this,int argc,char **argv)

{
  pointer *this_00;
  bool bVar1;
  undefined8 uVar2;
  ulong uVar3;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
  *pmVar4;
  reference __in;
  type *ptVar5;
  reference type_00;
  undefined1 *puVar6;
  size_t __n;
  UI_STRING *uis;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  UI_STRING *extraout_RDX;
  UI_STRING *extraout_RDX_00;
  UI_STRING *uis_00;
  UI_STRING *uis_01;
  UI_STRING *uis_02;
  undefined4 in_register_00000034;
  UI *pUVar7;
  string_view *filename;
  bool local_4b3;
  bool local_4b2;
  bool local_4b1;
  usage_exception *anon_var_1;
  exception *e;
  basic_string_view<char,_std::char_traits<char>_> local_478;
  TypeDef *local_468;
  TypeDef *type_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *__range4_1;
  TypeDef *type;
  const_iterator __end4;
  const_iterator __begin4;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *__range4;
  type *members_1;
  type *ns_1;
  const_iterator local_410;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
  *__range3_2;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> classes;
  type local_3c0;
  basic_string_view<char,_std::char_traits<char>_> local_3a8;
  namespace_members *local_398;
  type *members;
  type *ns;
  const_iterator local_380;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
  *__range2;
  basic_string_view<char,_std::char_traits<char>_> local_358;
  basic_string_view<char,_std::char_traits<char>_> local_348;
  undefined1 local_338 [8];
  writer ixx;
  undefined1 local_288 [8];
  task_group group;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  iterator __end3;
  iterator __begin3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  char *local_1c8;
  char *path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  undefined1 local_1a0 [8];
  cache c;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  undefined1 local_108 [8];
  reader args;
  time_point local_c8;
  time_point start;
  writer w;
  int result;
  char **argv_local;
  int argc_local;
  
  pUVar7 = (UI *)CONCAT44(in_register_00000034,argc);
  writer::writer((writer *)&start,pUVar7,(UI_STRING *)argv);
  local_c8 = get_start_time();
  puVar6 = options;
  reader::reader<int,char**,22ul>
            ((reader *)local_108,(int)this,(char **)pUVar7,(option (*) [22])options);
  bVar1 = reader::operator_cast_to_bool((reader *)local_108);
  __n = CONCAT71((int7)((ulong)puVar6 >> 8),bVar1);
  local_4b1 = true;
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,"help");
    bVar1 = reader::exists((reader *)local_108,&local_118);
    __n = CONCAT71((int7)(__n >> 8),bVar1);
    local_4b1 = true;
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 &c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_node_count,"?");
      local_4b1 = reader::exists((reader *)local_108,
                                 (string_view *)
                                 &c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
    }
  }
  if (local_4b1 == false) {
    process_args((reader *)local_108);
    get_files_to_cache_abi_cxx11_();
    winmd::reader::cache::
    cache<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,cppwinrt::run(int,char**)::__0>
              ((cache *)local_1a0,&local_1b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1b8);
    remove_foundation_types((cache *)local_1a0);
    build_filters((cache *)local_1a0);
    local_4b2 = true;
    if ((settings[0x80] & 1) == 0) {
      local_4b3 = false;
      if ((settings[0xaa] & 1) == 0) {
        local_4b3 = winmd::reader::filter::empty((filter *)(settings + 0x1a0));
      }
      local_4b2 = local_4b3;
    }
    settings[0x80] = local_4b2;
    build_fastabi_cache((cache *)local_1a0);
    if ((settings[0xa9] & 1) != 0) {
      local_1c8 = *(char **)pUVar7;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1d8," tool:  %\n");
      writer_base<cppwinrt::writer>::write<char*>
                ((writer_base<cppwinrt::writer> *)&start,&local_1d8,&local_1c8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&__range3," ver:   %\n");
      writer_base<cppwinrt::writer>::write<char[8]>
                ((writer_base<cppwinrt::writer> *)&start,
                 (basic_string_view<char,_std::char_traits<char>_> *)&__range3,
                 (char (*) [8])"2.3.4.5");
      __end3 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)settings);
      file = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)settings);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&file), bVar1) {
        local_208 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end3);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&__range3_1," in:    %\n");
        writer_base<cppwinrt::writer>::write<std::__cxx11::string>
                  ((writer_base<cppwinrt::writer> *)&start,
                   (basic_string_view<char,_std::char_traits<char>_> *)&__range3_1,local_208);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
      __end3_1 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(settings + 0x30));
      file_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(settings + 0x30));
      while (bVar1 = std::operator!=(&__end3_1,(_Self *)&file_1), bVar1) {
        local_238 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end3_1);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_248," ref:   %\n");
        writer_base<cppwinrt::writer>::write<std::__cxx11::string>
                  ((writer_base<cppwinrt::writer> *)&start,&local_248,local_238);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3_1);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_258," out:   %\n");
      writer_base<cppwinrt::writer>::write<std::__cxx11::string>
                ((writer_base<cppwinrt::writer> *)&start,&local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (settings + 0x60));
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&group.m_synchronous,
                   " cout:  %\n");
        writer_base<cppwinrt::writer>::write<std::__cxx11::string>
                  ((writer_base<cppwinrt::writer> *)&start,(string_view *)&group.m_synchronous,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (settings + 0xb0));
      }
    }
    writer_base<cppwinrt::writer>::flush_to_console((writer_base<cppwinrt::writer> *)&start,true);
    task_group::task_group((task_group *)local_288);
    this_00 = &ixx.generic_param_stack.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,"synchronous");
    bVar1 = reader::exists((reader *)local_108,(string_view *)this_00);
    pUVar7 = (UI *)(ulong)bVar1;
    task_group::synchronous((task_group *)local_288,bVar1);
    writer::writer((writer *)local_338,pUVar7,uis);
    write_preamble((writer *)local_338);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_348,"module;\n")
    ;
    writer_base<cppwinrt::writer>::write
              ((writer_base<cppwinrt::writer> *)local_338,(int)&local_348,__buf,__n);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_358,
               "\n#include <intrin.h>\n#include <algorithm>\n#include <array>\n#include <atomic>\n#include <charconv>\n#include <chrono>\n#include <cstddef>\n#include <cstring>\n#include <iterator>\n#include <map>\n#include <memory>\n#include <optional>\n#include <stdexcept>\n#include <string_view>\n#include <string>\n#include <thread>\n#include <tuple>\n#include <type_traits>\n#include <unordered_map>\n#include <utility>\n#include <vector>\n\n#if __has_include(<version>)\n#include <version>\n#endif\n\n#if __has_include(<windowsnumerics.impl.h>)\n#define WINRT_IMPL_NUMERICS\n#include <directxmath.h>\n#endif\n\n#ifndef WINRT_LEAN_AND_MEAN\n#include <ostream>\n#endif\n\n#ifdef __cpp_lib_format\n#include <format>\n#endif\n\n#ifdef __cpp_lib_source_location\n#include <source_location>\n#endif\n\n#ifdef __cpp_lib_coroutine\n\n#include <coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::coroutine_handle<T>;\n\n    using suspend_always = std::suspend_always;\n    using suspend_never = std::suspend_never;\n}\n\n#elif __has_include(<experimental/coroutine>)\n\n#include <experimental/coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::experimental::coroutine_handle<T>;\n\n    using suspend_always = std::experimental::suspend_always;\n    using suspend_never = std::experimental::suspend_never;\n}\n\n#else\n#error C++/WinRT requires coroutine support, which is currently missing. Try enabling C++20 in your compiler.\n#endif\n"
              );
    writer_base<cppwinrt::writer>::write
              ((writer_base<cppwinrt::writer> *)local_338,(int)&local_358,__buf_00,__n);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,
               "\nexport module winrt;\n#define WINRT_EXPORT export\n\n");
    writer_base<cppwinrt::writer>::write
              ((writer_base<cppwinrt::writer> *)local_338,
               (int)(basic_string_view<char,_std::char_traits<char>_> *)&__range2,__buf_01,__n);
    pmVar4 = winmd::reader::cache::namespaces((cache *)local_1a0);
    __end2 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
             ::begin(pmVar4);
    local_380 = std::
                map<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
                ::end(pmVar4);
    while( true ) {
      filename = (string_view *)&stack0xfffffffffffffc80;
      bVar1 = std::operator!=(&__end2,(_Self *)filename);
      if (!bVar1) break;
      ns = &std::
            _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>
            ::operator*(&__end2)->first;
      members = (type *)::std::
                        get<0ul,std::basic_string_view<char,std::char_traits<char>>const,winmd::reader::cache::namespace_members>
                                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>
                                    *)ns);
      local_398 = ::std::
                  get<1ul,std::basic_string_view<char,std::char_traits<char>>const,winmd::reader::cache::namespace_members>
                            ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>
                              *)ns);
      bVar1 = has_projected_types(local_398);
      if ((bVar1) &&
         (bVar1 = winmd::reader::filter::includes((filter *)(settings + 0x1a0),local_398), bVar1)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_3a8,"#include \"winrt/%.h\"\n");
        writer_base<cppwinrt::writer>::write<std::basic_string_view<char,std::char_traits<char>>>
                  ((writer_base<cppwinrt::writer> *)local_338,&local_3a8,
                   (basic_string_view<char,_std::char_traits<char>_> *)members);
        local_3c0.ns = (basic_string_view<char,_std::char_traits<char>_> *)members;
        local_3c0.members = local_398;
        local_3c0.c = (cache *)local_1a0;
        task_group::add<cppwinrt::run(int,char**)::__1>((task_group *)local_288,&local_3c0);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>
      ::operator++(&__end2);
    }
    if ((settings[0x80] & 1) != 0) {
      write_base_h();
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &classes.
                        super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (settings + 0x60),"winrt/winrt.ixx");
      filename = (string_view *)
                 &classes.
                  super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      writer_base<cppwinrt::writer>::flush_to_file
                ((writer_base<cppwinrt::writer> *)local_338,(string *)filename);
      ::std::__cxx11::string::~string
                ((string *)
                 &classes.
                  super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if ((settings[0xaa] & 1) != 0) {
      std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::vector
                ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                 &__range3_2);
      pmVar4 = winmd::reader::cache::namespaces((cache *)local_1a0);
      __end3_2 = std::
                 map<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
                 ::begin(pmVar4);
      local_410 = std::
                  map<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
                  ::end(pmVar4);
      while( true ) {
        filename = (string_view *)&stack0xfffffffffffffbf0;
        bVar1 = std::operator!=(&__end3_2,(_Self *)filename);
        if (!bVar1) break;
        __in = std::
               _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>
               ::operator*(&__end3_2);
        ::std::
        get<0ul,std::basic_string_view<char,std::char_traits<char>>const,winmd::reader::cache::namespace_members>
                  (__in);
        ptVar5 = ::std::
                 get<1ul,std::basic_string_view<char,std::char_traits<char>>const,winmd::reader::cache::namespace_members>
                           (__in);
        __end4 = std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::begin
                           (&ptVar5->classes);
        type = (TypeDef *)
               std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::end
                         (&ptVar5->classes);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                                           *)&type), bVar1) {
          type_00 = __gnu_cxx::
                    __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                    ::operator*(&__end4);
          bVar1 = winmd::reader::filter::includes((filter *)(settings + 0x1b8),type_00);
          if (bVar1) {
            std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::push_back
                      ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                       &__range3_2,type_00);
          }
          __gnu_cxx::
          __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
          ::operator++(&__end4);
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>
        ::operator++(&__end3_2);
      }
      bVar1 = std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::empty
                        ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                         &__range3_2);
      if (!bVar1) {
        write_fast_forward_h
                  ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                   &__range3_2);
        write_module_g_cpp((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                            *)&__range3_2);
        __end4_1 = std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
                   begin((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                         &__range3_2);
        type_1 = (TypeDef *)
                 std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::end
                           ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                             *)&__range3_2);
        while( true ) {
          filename = (string_view *)&type_1;
          bVar1 = __gnu_cxx::operator!=
                            (&__end4_1,
                             (__normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                              *)filename);
          if (!bVar1) break;
          local_468 = __gnu_cxx::
                      __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                      ::operator*(&__end4_1);
          write_component_g_h(local_468);
          write_component_g_cpp(local_468);
          write_component_h(local_468);
          write_component_cpp(local_468);
          __gnu_cxx::
          __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
          ::operator++(&__end4_1);
        }
      }
      std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::~vector
                ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                 &__range3_2);
    }
    task_group::get((task_group *)local_288);
    uis_00 = extraout_RDX;
    if ((settings[0xa9] & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_478," time:  %ms\n");
      e = (exception *)get_elapsed_time(&local_c8);
      filename = &local_478;
      writer_base<cppwinrt::writer>::write<long>
                ((writer_base<cppwinrt::writer> *)&start,filename,(long *)&e);
      uis_00 = extraout_RDX_00;
    }
    writer::~writer((writer *)local_338,(UI *)filename,uis_00);
    task_group::~task_group((task_group *)local_288);
    winmd::reader::cache::~cache((cache *)local_1a0);
    reader::~reader((reader *)local_108,(UI *)filename,uis_01);
    pUVar7 = (UI *)0x1;
    writer_base<cppwinrt::writer>::flush_to_console((writer_base<cppwinrt::writer> *)&start,true);
    writer::~writer((writer *)&start,pUVar7,uis_02);
    return 0;
  }
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&usage_exception::typeinfo,0);
}

Assistant:

static int run(int const argc, char** argv)
    {
        int result{};
        writer w;

        try
        {
            auto start = get_start_time();

            reader args{ argc, argv, options };

            if (!args || args.exists("help") || args.exists("?"))
            {
                throw usage_exception{};
            }

            process_args(args);
            cache c{ get_files_to_cache(), [](TypeDef const& type) { return type.Flags().WindowsRuntime(); } };
            remove_foundation_types(c);
            build_filters(c);
            settings.base = settings.base || (!settings.component && settings.projection_filter.empty());
            build_fastabi_cache(c);

            if (settings.verbose)
            {
                {
                    char* path = argv[0];
#if defined(_WIN32) || defined(_WIN64)
                    char path_buf[32768];
                    DWORD path_size = GetModuleFileNameA(nullptr, path_buf, sizeof(path_buf));
                    if (path_size)
                    {
                        path_buf[sizeof(path_buf) - 1] = 0;
                        path = path_buf;
                    }
#endif
                    w.write(" tool:  %\n", path);
                }
                w.write(" ver:   %\n", CPPWINRT_VERSION_STRING);

                for (auto&& file : settings.input)
                {
                    w.write(" in:    %\n", file);
                }

                for (auto&& file : settings.reference)
                {
                    w.write(" ref:   %\n", file);
                }

                w.write(" out:   %\n", settings.output_folder);

                if (!settings.component_folder.empty())
                {
                    w.write(" cout:  %\n", settings.component_folder);
                }
            }

            w.flush_to_console();
            task_group group;
            group.synchronous(args.exists("synchronous"));
            writer ixx;
            write_preamble(ixx);
            ixx.write("module;\n");
            ixx.write(strings::base_includes);
            ixx.write("\nexport module winrt;\n#define WINRT_EXPORT export\n\n");

            for (auto&&[ns, members] : c.namespaces())
            {
                if (!has_projected_types(members) || !settings.projection_filter.includes(members))
                {
                    continue;
                }

                ixx.write("#include \"winrt/%.h\"\n", ns);

                group.add([&, &ns = ns, &members = members]
                {
                    write_namespace_0_h(ns, members);
                    write_namespace_1_h(ns, members);
                    write_namespace_2_h(ns, members);
                    write_namespace_h(c, ns, members);
                });
            }

            if (settings.base)
            {
                write_base_h();
                ixx.flush_to_file(settings.output_folder + "winrt/winrt.ixx");
            }

            if (settings.component)
            {
                std::vector<TypeDef> classes;

                for (auto&&[ns, members] : c.namespaces())
                {
                    for (auto&& type : members.classes)
                    {
                        if (settings.component_filter.includes(type))
                        {
                            classes.push_back(type);
                        }
                    }
                }

                if (!classes.empty())
                {
                    write_fast_forward_h(classes);
                    write_module_g_cpp(classes);

                    for (auto&& type : classes)
                    {
                        write_component_g_h(type);
                        write_component_g_cpp(type);
                        write_component_h(type);
                        write_component_cpp(type);
                    }
                }
            }

            group.get();

            if (settings.verbose)
            {
                w.write(" time:  %ms\n", get_elapsed_time(start));
            }
        }
        catch (usage_exception const&)
        {
            print_usage(w);
        }
        catch (std::exception const& e)
        {
            w.write("cppwinrt : error %\n", e.what());
            result = 1;
        }

        w.flush_to_console(result == 0);
        return result;
    }